

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_Constractor2_Test::TestBody(ConfidentialTxOut_Constractor2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Amount AVar4;
  AssertHelper local_948;
  Message local_940;
  int local_934;
  int64_t local_930;
  undefined1 local_928;
  Amount local_920;
  int64_t local_910;
  undefined1 local_908 [8];
  AssertionResult gtest_ar_14;
  Message local_8f0;
  string local_8e8;
  ByteData local_8c8;
  string local_8b0;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_13;
  Message local_878;
  string local_870;
  ByteData local_850;
  string local_838;
  undefined1 local_818 [8];
  AssertionResult gtest_ar_12;
  Message local_800;
  string local_7f8;
  ConfidentialNonce local_7d8;
  string local_7b0;
  undefined1 local_790 [8];
  AssertionResult gtest_ar_11;
  Message local_778;
  string local_770;
  Script local_750;
  string local_718;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_10;
  Message local_6e0;
  string local_6d8;
  ConfidentialValue local_6b8;
  string local_690;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_9;
  Message local_658;
  string local_650;
  ConfidentialAssetId local_630;
  string local_608;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar_8;
  ConfidentialTxOutReference txout_ref;
  Message local_4d8;
  ByteData256 local_4d0;
  string local_4b8;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_7;
  Message local_480;
  int local_474;
  int64_t local_470;
  undefined1 local_468;
  Amount local_460;
  int64_t local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_6;
  Message local_430;
  string local_428;
  ByteData local_408;
  string local_3f0;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_5;
  Message local_3b8;
  string local_3b0;
  ByteData local_390;
  string local_378;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_4;
  Message local_340;
  string local_338;
  ConfidentialNonce local_318;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_3;
  Message local_2b8;
  string local_2b0;
  Script local_290;
  string local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_2;
  Message local_220;
  string local_218;
  ConfidentialValue local_1f8;
  string local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_1;
  Message local_198;
  string local_190;
  ConfidentialAssetId local_160;
  string local_138;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  ConfidentialTxOut txout;
  ConfidentialTxOut_Constractor2_Test *this_local;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)&gtest_ar.message_,&exp_script,&exp_asset,&exp_value,&exp_nonce,
             &exp_surjection_proof,&exp_range_proof);
  cfd::core::ConfidentialTxOut::GetAsset(&local_160,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_138,&local_160);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_190,&exp_asset);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_118,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_138);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  cfd::core::ConfidentialTxOut::GetConfidentialValue
            (&local_1f8,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_1d0,&local_1f8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_218,&exp_value);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1b0,"txout.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d0);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  cfd::core::AbstractTxOut::GetLockingScript(&local_290,(AbstractTxOut *)&gtest_ar.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_258,&local_290);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_2b0,&exp_script);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_238,"txout.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_258);
  cfd::core::Script::~Script(&local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  cfd::core::ConfidentialTxOut::GetNonce(&local_318,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_2f0,&local_318);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_338,&exp_nonce);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2d0,"txout.GetNonce().GetHex().c_str()","exp_nonce.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_2f0);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  cfd::core::ConfidentialTxOut::GetRangeProof(&local_390,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_378,&local_390);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3b0,&exp_range_proof);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_358,"txout.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_378);
  cfd::core::ByteData::~ByteData(&local_390);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  cfd::core::ConfidentialTxOut::GetSurjectionProof
            (&local_408,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3f0,&local_408);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_428,&exp_surjection_proof);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3d0,"txout.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_3f0);
  cfd::core::ByteData::~ByteData(&local_408);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  AVar4 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)&gtest_ar.message_);
  local_470 = AVar4.amount_;
  local_468 = AVar4.ignore_check_;
  local_460.amount_ = local_470;
  local_460.ignore_check_ = (bool)local_468;
  local_450 = cfd::core::Amount::GetSatoshiValue(&local_460);
  local_474 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_448,"txout.GetValue().GetSatoshiValue()","0",&local_450,
             &local_474);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  cfd::core::ConfidentialTxOut::GetWitnessHash(&local_4d0,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_4b8,&local_4d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_498,"txout.GetWitnessHash().GetHex().c_str()",
             "\"51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093\"",pcVar2,
             "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");
  std::__cxx11::string::~string((string *)&local_4b8);
  cfd::core::ByteData256::~ByteData256(&local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txout_ref.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txout_ref.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txout_ref.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)&gtest_ar_8.message_,
             (ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialTxOutReference::GetAsset
            (&local_630,(ConfidentialTxOutReference *)&gtest_ar_8.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_608,&local_630);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_650,&exp_asset);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5e8,"txout_ref.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_608);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue
            (&local_6b8,(ConfidentialTxOutReference *)&gtest_ar_8.message_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_690,&local_6b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_6d8,&exp_value);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_670,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_690);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_6b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  cfd::core::AbstractTxOutReference::GetLockingScript
            (&local_750,(AbstractTxOutReference *)&gtest_ar_8.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_718,&local_750);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_770,&exp_script);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6f8,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_718);
  cfd::core::Script::~Script(&local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_778);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  cfd::core::ConfidentialTxOutReference::GetNonce
            (&local_7d8,(ConfidentialTxOutReference *)&gtest_ar_8.message_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_7b0,&local_7d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_7f8,&exp_nonce);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_790,"txout_ref.GetNonce().GetHex().c_str()",
             "exp_nonce.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_7b0);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_7d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_790);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_800);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  cfd::core::ConfidentialTxOutReference::GetRangeProof
            (&local_850,(ConfidentialTxOutReference *)&gtest_ar_8.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_838,&local_850);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_870,&exp_range_proof);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_818,"txout_ref.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_838);
  cfd::core::ByteData::~ByteData(&local_850);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  cfd::core::ConfidentialTxOutReference::GetSurjectionProof
            (&local_8c8,(ConfidentialTxOutReference *)&gtest_ar_8.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_8b0,&local_8c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_8e8,&exp_surjection_proof);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_890,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_8b0);
  cfd::core::ByteData::~ByteData(&local_8c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  AVar4 = cfd::core::AbstractTxOutReference::GetValue
                    ((AbstractTxOutReference *)&gtest_ar_8.message_);
  local_930 = AVar4.amount_;
  local_928 = AVar4.ignore_check_;
  local_920.amount_ = local_930;
  local_920.ignore_check_ = (bool)local_928;
  local_910 = cfd::core::Amount::GetSatoshiValue(&local_920);
  local_934 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_908,"txout_ref.GetValue().GetSatoshiValue()","0",&local_910,
             &local_934);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar1) {
    testing::Message::Message(&local_940);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_908);
    testing::internal::AssertHelper::AssertHelper
              (&local_948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_948,&local_940);
    testing::internal::AssertHelper::~AssertHelper(&local_948);
    testing::Message::~Message(&local_940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)&gtest_ar_8.message_);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor2) {
  // Script, ConfidentialAssetId, ConfidentialValue, ConfidentialNonce, ByteData, ByteData
  ConfidentialTxOut txout(exp_script, exp_asset, exp_value, exp_nonce,
                          exp_surjection_proof, exp_range_proof);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}